

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_background.h
# Opt level: O1

double __thiscall SAUF_BG<UF>::Alloc(SAUF_BG<UF> *this)

{
  double dVar1;
  Mat1b *pMVar2;
  int *piVar3;
  Mat1i *pMVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Mat local_70 [96];
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  dVar6 = UF::Alloc((int)((long)*(int *)&pMVar2->field_0xc + 1U >> 1) *
                    (*(int *)&pMVar2->field_0x8 + 1) + 1,
                    &(this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_);
  lVar5 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last =
       (double)lVar5;
  piVar3 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_)->field_0x40;
  cv::Mat::Mat(local_70,*piVar3,piVar3[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_)->super_Mat,
                     local_70);
  cv::Mat::~Mat(local_70);
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  lVar5 = cv::getTickCount();
  dVar8 = (double)lVar5 -
          (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last = dVar8;
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.total + dVar8
  ;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.tick_frequency_;
  lVar5 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last =
       (double)lVar5;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  lVar5 = cv::getTickCount();
  dVar7 = (double)lVar5 -
          (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.last = dVar7;
  (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.counter_.total + dVar7
  ;
  return dVar6 + ((dVar8 * 1000.0) / dVar1 -
                 (dVar7 * 1000.0) /
                 (this->super_Labeling2D<(Connectivity2D)8,_true>).super_Labeling.perf_.
                 tick_frequency_);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc((size_t)img_.rows * (((size_t)img_.cols + 1) / 2) + ((size_t)img_.cols + 1) / 2 + 1, perf_);
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();
        // Return total time
        return ls_t + ma_t;
    }